

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Operator.cpp
# Opt level: O0

int slang::ast::OpInfo::getPrecedence(BinaryOperator op)

{
  int iVar1;
  BinaryOperator op_local;
  
  iVar1 = (*(code *)(&DAT_00b40b14 + *(int *)(&DAT_00b40b14 + (ulong)op * 4)))();
  return iVar1;
}

Assistant:

int OpInfo::getPrecedence(BinaryOperator op) {
    // Note: the precedence levels here match what is returned by
    // SyntaxFacts::getPrecedence.
    switch (op) {
        case BinaryOperator::LogicalImplication:
        case BinaryOperator::LogicalEquivalence:
            return 2;
        case BinaryOperator::LogicalOr:
            return 3;
        case BinaryOperator::LogicalAnd:
            return 4;
        case BinaryOperator::BinaryOr:
            return 5;
        case BinaryOperator::BinaryXor:
        case BinaryOperator::BinaryXnor:
            return 6;
        case BinaryOperator::BinaryAnd:
            return 7;
        case BinaryOperator::Equality:
        case BinaryOperator::Inequality:
        case BinaryOperator::CaseEquality:
        case BinaryOperator::CaseInequality:
        case BinaryOperator::WildcardEquality:
        case BinaryOperator::WildcardInequality:
            return 8;
        case BinaryOperator::GreaterThanEqual:
        case BinaryOperator::GreaterThan:
        case BinaryOperator::LessThanEqual:
        case BinaryOperator::LessThan:
            return 9;
        case BinaryOperator::LogicalShiftLeft:
        case BinaryOperator::LogicalShiftRight:
        case BinaryOperator::ArithmeticShiftLeft:
        case BinaryOperator::ArithmeticShiftRight:
            return 10;
        case BinaryOperator::Add:
        case BinaryOperator::Subtract:
            return 11;
        case BinaryOperator::Multiply:
        case BinaryOperator::Divide:
        case BinaryOperator::Mod:
            return 12;
        case BinaryOperator::Power:
            return 13;
    }
    SLANG_UNREACHABLE;
}